

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ES5ArrayTypeHandler.cpp
# Opt level: O1

DescriptorFlags __thiscall
Js::ES5ArrayTypeHandlerBase<unsigned_short>::GetItemSetter
          (ES5ArrayTypeHandlerBase<unsigned_short> *this,ES5Array *arr,DynamicObject *instance,
          uint32 index,Var *setterValue,ScriptContext *requestContext)

{
  byte bVar1;
  Var pvVar2;
  bool bVar3;
  BOOL BVar4;
  JavascriptArray *pJVar5;
  uint32 local_3c;
  void *local_38;
  int i;
  IndexPropertyDescriptor *descriptor;
  
  local_3c = index;
  bVar3 = JsUtil::
          BaseDictionary<unsigned_int,_Js::IndexPropertyDescriptor,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_2U,_2U,_1U,_4U>,_DefaultComparer,_JsUtil::SimpleDictionaryEntry,_JsUtil::NoResizeLock>
          ::TryGetReference<unsigned_int>
                    ((((this->indexPropertyMap).ptr)->indexPropertyMap).ptr,&local_3c,
                     (IndexPropertyDescriptor **)&i,(int *)&local_38);
  if (bVar3) {
    if ((_i->Attributes & 8) != 0) {
      return None;
    }
    pJVar5 = &VarTo<Js::ES5Array,Js::DynamicObject>(instance)->super_JavascriptArray;
    BVar4 = JavascriptArray::DirectGetItemAt<void*>(pJVar5,index,&local_38);
    if (BVar4 == 0) {
      pvVar2 = (_i->Setter).ptr;
      if (pvVar2 == (Var)0x0) {
        return None;
      }
      *setterValue = pvVar2;
      return Accessor;
    }
    bVar1 = _i->Attributes;
  }
  else {
    pJVar5 = &VarTo<Js::ES5Array,Js::DynamicObject>(instance)->super_JavascriptArray;
    BVar4 = JavascriptArray::DirectGetItemAt<void*>(pJVar5,index,&local_38);
    if (BVar4 == 0) {
      return None;
    }
    bVar1 = this->dataItemAttributes;
  }
  return bVar1 & Writable | Data;
}

Assistant:

DescriptorFlags ES5ArrayTypeHandlerBase<T>::GetItemSetter(ES5Array* arr, DynamicObject* instance, uint32 index, Var* setterValue, ScriptContext* requestContext)
    {
        IndexPropertyDescriptor* descriptor;
        if (indexPropertyMap->TryGetReference(index, &descriptor))
        {
            if (descriptor->Attributes & PropertyDeleted)
            {
                return None;
            }

            if (HasDataItem(VarTo<ES5Array>(instance), index))
            {
                // not a setter but shadows
                return (descriptor->Attributes & PropertyWritable) ? WritableData : Data;
            }
            else if (descriptor->Setter)
            {
                *setterValue = descriptor->Setter;
                return Accessor;
            }
        }
        else if (HasDataItem(VarTo<ES5Array>(instance), index))
        {
            return (GetDataItemAttributes() & PropertyWritable) ? WritableData : Data;
        }

        return None;
    }